

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O2

void secp256k1_ge_set_infinity(secp256k1_ge *r)

{
  r->infinity = 1;
  secp256k1_fe_set_int(&r->x,0);
  secp256k1_fe_set_int(&r->y,0);
  secp256k1_ge_verify(r);
  return;
}

Assistant:

static void secp256k1_ge_set_infinity(secp256k1_ge *r) {
    r->infinity = 1;
    secp256k1_fe_set_int(&r->x, 0);
    secp256k1_fe_set_int(&r->y, 0);

    SECP256K1_GE_VERIFY(r);
}